

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR xpath_substring(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  longdouble lVar1;
  lyxp_set *set_00;
  ly_bool lVar2;
  LY_ERR ret__;
  LY_ERR LVar3;
  uint uVar4;
  lysc_node *plVar5;
  char *pcVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  uint32_t uVar10;
  ly_ctx *plVar11;
  long lVar12;
  ulong uVar13;
  long local_68;
  ushort uStack_60;
  short sStack_40;
  
  set_00 = *args;
  if ((options & 0x1c) == 0) {
    uVar10 = 4;
    LVar3 = lyxp_set_cast(set_00,LYXP_SET_STRING);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    LVar3 = xpath_round(args + 1,uVar10,args[1],options);
    if (LVar3 != LY_SUCCESS) {
      return ~LY_SUCCESS;
    }
    lVar1 = *(longdouble *)&args[1]->val;
    uStack_60 = (ushort)((unkuint10)lVar1 >> 0x40);
    local_68 = SUB108(lVar1,0);
    if (((unkuint10)lVar1 & 0x7fff) == 0 ||
        (ushort)((uStack_60 & 0x7fff) - 1) < 0x7ffe && local_68 < 0) {
      uVar13 = (ulong)ROUND(-(longdouble)1 + lVar1);
    }
    else {
      uVar13 = (long)(short)uStack_60 >> 0xf ^ 0x7fffffff;
      if ((~uStack_60 & 0x7fff) != 0 || local_68 != -0x8000000000000000) {
        uVar13 = 0x7fffffff;
      }
    }
    lVar12 = 0x7fffffff;
    if (arg_count == 3) {
      LVar3 = xpath_round(args + 2,uVar10,args[2],options);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      lVar1 = (args[2]->val).num;
      sStack_40 = (short)((unkuint10)lVar1 >> 0x40);
      if (sStack_40 < 0 || NAN(lVar1)) {
        lVar12 = 0;
      }
      else if (lVar1 != (longdouble)INFINITY) {
        lVar12 = (long)(int)ROUND(lVar1);
      }
    }
    uVar4 = 0;
    uVar10 = 0;
    for (uVar7 = 0; uVar9 = (ulong)uVar7,
        *(char *)((long)&(((*args)->val).nodes)->node + uVar9) != '\0'; uVar7 = uVar7 + 1) {
      if ((long)uVar9 < (long)uVar13) {
        uVar4 = uVar4 + 1;
      }
      else {
        if ((long)(lVar12 + uVar13) <= (long)uVar9) break;
        uVar10 = uVar10 + 1;
      }
    }
    set_fill_string(set,(char *)((long)&(((*args)->val).nodes)->node + (ulong)uVar4),uVar10);
    return LY_SUCCESS;
  }
  if ((set_00->type == LYXP_SET_SCNODE_SET) &&
     (plVar5 = warn_get_scnode_in_ctx(set_00), plVar5 != (lysc_node *)0x0)) {
    if ((plVar5->nodetype & 0xc) == 0) {
      plVar11 = set->ctx;
      pcVar6 = lys_nodetype2str(plVar5->nodetype);
      pcVar8 = "Argument #1 of %s is a %s node \"%s\".";
    }
    else {
      lVar2 = warn_is_string_type((lysc_type *)plVar5[1].parent);
      if (lVar2 != '\0') goto LAB_001a6af3;
      plVar11 = set->ctx;
      pcVar6 = plVar5->name;
      pcVar8 = "Argument #1 of %s is node \"%s\", not of string-type.";
    }
    ly_log(plVar11,LY_LLWRN,LY_SUCCESS,pcVar8,"xpath_substring",pcVar6);
  }
LAB_001a6af3:
  if ((args[1]->type == LYXP_SET_SCNODE_SET) &&
     (plVar5 = warn_get_scnode_in_ctx(args[1]), plVar5 != (lysc_node *)0x0)) {
    if ((plVar5->nodetype & 0xc) == 0) {
      plVar11 = set->ctx;
      pcVar6 = lys_nodetype2str(plVar5->nodetype);
      pcVar8 = "Argument #2 of %s is a %s node \"%s\".";
    }
    else {
      lVar2 = warn_is_numeric_type((lysc_type *)plVar5[1].parent);
      if (lVar2 != '\0') goto LAB_001a6b6e;
      plVar11 = set->ctx;
      pcVar6 = plVar5->name;
      pcVar8 = "Argument #2 of %s is node \"%s\", not of numeric type.";
    }
    ly_log(plVar11,LY_LLWRN,LY_SUCCESS,pcVar8,"xpath_substring",pcVar6);
  }
LAB_001a6b6e:
  if (((arg_count == 3) && (args[2]->type == LYXP_SET_SCNODE_SET)) &&
     (plVar5 = warn_get_scnode_in_ctx(args[2]), plVar5 != (lysc_node *)0x0)) {
    if ((plVar5->nodetype & 0xc) == 0) {
      plVar11 = set->ctx;
      pcVar6 = lys_nodetype2str(plVar5->nodetype);
      pcVar8 = "Argument #3 of %s is a %s node \"%s\".";
    }
    else {
      lVar2 = warn_is_numeric_type((lysc_type *)plVar5[1].parent);
      if (lVar2 != '\0') goto LAB_001a6c7e;
      plVar11 = set->ctx;
      pcVar6 = plVar5->name;
      pcVar8 = "Argument #3 of %s is node \"%s\", not of numeric type.";
    }
    ly_log(plVar11,LY_LLWRN,LY_SUCCESS,pcVar8,"xpath_substring",pcVar6);
  }
LAB_001a6c7e:
  set_scnode_clear_ctx(set,1);
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_substring(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    int64_t start;
    int32_t len;
    uint32_t str_start, str_len, pos;
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;

    if (options & LYXP_SCNODE_ALL) {
        if ((args[0]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }

        if ((args[1]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_numeric_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #2 of %s is node \"%s\", not of numeric type.", __func__, sleaf->name);
            }
        }

        if ((arg_count == 3) && (args[2]->type == LYXP_SET_SCNODE_SET) &&
                (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[2]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #3 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_numeric_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #3 of %s is node \"%s\", not of numeric type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    rc = lyxp_set_cast(args[0], LYXP_SET_STRING);
    LY_CHECK_RET(rc);

    /* start */
    if (xpath_round(&args[1], 1, args[1], options)) {
        return -1;
    }
    if (isfinite(args[1]->val.num)) {
        start = args[1]->val.num - 1;
    } else if (isinf(args[1]->val.num) && signbit(args[1]->val.num)) {
        start = INT32_MIN;
    } else {
        start = INT32_MAX;
    }

    /* len */
    if (arg_count == 3) {
        rc = xpath_round(&args[2], 1, args[2], options);
        LY_CHECK_RET(rc);
        if (isnan(args[2]->val.num) || signbit(args[2]->val.num)) {
            len = 0;
        } else if (isfinite(args[2]->val.num)) {
            len = args[2]->val.num;
        } else {
            len = INT32_MAX;
        }
    } else {
        len = INT32_MAX;
    }

    /* find matching character positions */
    str_start = 0;
    str_len = 0;
    for (pos = 0; args[0]->val.str[pos]; ++pos) {
        if (pos < start) {
            ++str_start;
        } else if (pos < start + len) {
            ++str_len;
        } else {
            break;
        }
    }

    set_fill_string(set, args[0]->val.str + str_start, str_len);
    return LY_SUCCESS;
}